

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void clear_buckets(ecs_map_t *map)

{
  ecs_bucket_t *peVar1;
  ulong uVar2;
  ulong uVar3;
  
  peVar1 = map->buckets;
  uVar3 = 0;
  uVar2 = (ulong)(uint)map->bucket_count;
  if (map->bucket_count < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 0x18 - uVar3 != 0; uVar3 = uVar3 + 0x18) {
    clear_bucket((ecs_bucket_t *)((long)&peVar1->keys + uVar3));
  }
  (*ecs_os_api.free_)(peVar1);
  map->buckets = (ecs_bucket_t *)0x0;
  map->bucket_count = 0;
  return;
}

Assistant:

static
void clear_buckets(
    ecs_map_t *map)
{
    ecs_bucket_t *buckets = map->buckets;
    int32_t i, count = map->bucket_count;
    for (i = 0; i < count; i ++) {
        clear_bucket(&buckets[i]);
    }
    ecs_os_free(buckets);
    map->buckets = NULL;
    map->bucket_count = 0;
}